

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang,string *param_3)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool forResponseFile;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string responseFlag;
  string includeFlags;
  string name;
  string responseFlagVar;
  string responseVar;
  cmAlphaNum local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  cmAlphaNum local_80;
  string local_50;
  
  local_148.View_._M_len = (size_t)&DAT_00000006;
  local_148.View_._M_str = "CMAKE_";
  local_80.View_._M_str = (lang->_M_dataplus)._M_p;
  local_80.View_._M_len = lang->_M_string_length;
  cmStrCat<char[32]>(&local_50,&local_148,&local_80,(char (*) [32])"_USE_RESPONSE_FILE_FOR_INCLUDES"
                    );
  forResponseFile = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&local_50);
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  GetConfigName_abi_cxx11_((string *)&local_148,this);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)pcVar2,&local_118,pcVar1,lang,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  GetConfigName_abi_cxx11_((string *)&local_148,this);
  cmLocalGenerator::GetIncludeFlags
            (&local_e0,(cmLocalGenerator *)pcVar2,&local_118,pcVar1,lang,(string *)&local_148,
             forResponseFile);
  std::__cxx11::string::~string((string *)&local_148);
  if (local_e0._M_string_length != 0) {
    if (forResponseFile) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148
                     ,"CMAKE_",lang);
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148
                     ,"_RESPONSE_FILE_FLAG");
      std::__cxx11::string::~string((string *)&local_148);
      psVar3 = cmMakefile::GetSafeDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_a0);
      std::__cxx11::string::string((string *)&local_100,(string *)psVar3);
      if (local_100._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&local_100);
      }
      local_148.View_._M_len = (size_t)&DAT_00000009;
      local_148.View_._M_str = "includes_";
      local_80.View_._M_str = (lang->_M_dataplus)._M_p;
      local_80.View_._M_len = lang->_M_string_length;
      cmStrCat<char[5]>(&local_c0,&local_148,&local_80,(char (*) [5])0x67f845);
      makefile_depends =
           &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
            ::operator[](&this->FlagFileDepends,lang)->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      CreateResponseFile((string *)&local_80,this,&local_c0,&local_e0,makefile_depends);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148
                     ,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80)
      ;
      std::__cxx11::string::~string((string *)&local_80);
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,&local_e0);
    }
  }
  std::__cxx11::string::~string((string *)&local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang,
                                                const std::string& /*config*/)
{
  std::string responseVar =
    cmStrCat("CMAKE_", lang, "_USE_RESPONSE_FILE_FOR_INCLUDES");
  bool useResponseFile = this->Makefile->IsOn(responseVar);

  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());

  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, lang, this->GetConfigName(),
    useResponseFile);
  if (includeFlags.empty()) {
    return;
  }

  if (useResponseFile) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    std::string responseFlag =
      this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
    std::string name = cmStrCat("includes_", lang, ".rsp");
    std::string arg = std::move(responseFlag) +
      this->CreateResponseFile(name, includeFlags,
                               this->FlagFileDepends[lang]);
    this->LocalGenerator->AppendFlags(flags, arg);
  } else {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
  }
}